

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void __thiscall benchmark::internal::Benchmark::Benchmark(Benchmark *this,char *name)

{
  BenchmarkImp *this_00;
  allocator local_19;
  
  this->_vptr_Benchmark = (_func_int **)&PTR__Benchmark_001427b8;
  this_00 = (BenchmarkImp *)operator_new(0x80);
  std::__cxx11::string::string((string *)this_00,name,&local_19);
  this_00->report_mode_ = RM_Unspecified;
  (this_00->args_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->args_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this_00->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this_00->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this_00->range_multiplier_ = 8;
  this_00->complexity_ = oNone;
  (this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->thread_counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->min_time_ = 0.0;
  *(undefined8 *)((long)&this_00->min_time_ + 6) = 0;
  this->imp_ = this_00;
  return;
}

Assistant:

Benchmark::Benchmark(const char* name)
    : imp_(new BenchmarkImp(name))
{
}